

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# submit-3AddBeforeQuery.cpp
# Opt level: O3

void AddPolygonFromAddBeforeQuery
               (int id,int n,
               vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               *polygon)

{
  undefined8 *puVar1;
  pointer ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  pointer ppVar6;
  long lVar7;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *__range1;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Branch local_58;
  
  ppVar6 = (polygon->
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (polygon->
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_58.m_rect.m_max = _DAT_00108250;
  local_58.m_rect.m_min = _DAT_00108260;
  if (ppVar6 != ppVar2) {
    dVar8 = -5000000.0;
    dVar9 = -5000000.0;
    dVar10 = 5000000.0;
    dVar11 = 5000000.0;
    do {
      auVar4._8_8_ = dVar11;
      auVar4._0_8_ = dVar10;
      local_58.m_rect.m_min = (double  [2])minpd((undefined1  [16])*ppVar6,auVar4);
      auVar3._8_8_ = dVar9;
      auVar3._0_8_ = dVar8;
      local_58.m_rect.m_max = (double  [2])maxpd((undefined1  [16])*ppVar6,auVar3);
      ppVar6 = ppVar6 + 1;
      dVar10 = local_58.m_rect.m_min[0];
      dVar11 = local_58.m_rect.m_min[1];
      dVar8 = local_58.m_rect.m_max[0];
      dVar9 = local_58.m_rect.m_max[1];
    } while (ppVar6 != ppVar2);
  }
  local_58.m_data = Poly_cnt;
  local_58.m_child = (Node *)0x0;
  RTree<int,_double,_2,_double,_8,_4>::InsertRect(&Rtree,&local_58,&Rtree.m_root,0);
  if (0 < n) {
    ppVar6 = (polygon->
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      puVar1 = (undefined8 *)((long)&ppVar6->first + lVar7);
      uVar5 = puVar1[1];
      *(undefined8 *)((long)pgon[0] + lVar7) = *puVar1;
      *(undefined8 *)((long)pgon[0] + lVar7 + 8) = uVar5;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar7);
  }
  GridSetup(pgon,n,100,(pGridSet)(PolyGrid + Poly_cnt));
  Poly_id[Poly_cnt] = id;
  Poly_cnt = Poly_cnt + 1;
  return;
}

Assistant:

void AddPolygonFromAddBeforeQuery(int id, int n, std::vector<std::pair<double, double> > &polygon) {
    double mnx = MAX_POS, mny = MAX_POS, mxx = -MAX_POS, mxy = -MAX_POS;
    for (auto now : polygon)
    {
        if (now.first < mnx) mnx = now.first;
        if (now.second < mny) mny = now.second;
        if (now.first > mxx) mxx = now.first;
        if (now.second > mxy) mxy = now.second;
    }
    Rect R = Rect(mnx, mny, mxx, mxy);
    Rtree.Insert(R.min, R.max, Poly_cnt);

    for (int i = 0; i < n; i++)
        pgon[i][0] = polygon[i].first,
        pgon[i][1] = polygon[i].second;
    GridSetup(pgon, n, Grid_Resolution, &PolyGrid[Poly_cnt]);
    Poly_id[Poly_cnt] = id;
    Poly_cnt ++;
}